

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O0

void __thiscall
vkt::BindingModel::anon_unknown_1::ImageInstanceImages::ImageInstanceImages
          (ImageInstanceImages *this,DeviceInterface *vki,VkDevice device,deUint32 queueFamilyIndex,
          VkQueue queue,Allocator *allocator,VkDescriptorType descriptorType,
          VkImageViewType viewType,int numImages,deUint32 baseMipLevel,deUint32 baseArraySlice)

{
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  RefData<vk::Handle<(vk::HandleType)13>_> data_00;
  RefData<vk::Handle<(vk::HandleType)9>_> data_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data_02;
  Allocator *pAVar1;
  Allocator *pAVar2;
  deUint32 dVar3;
  VkDevice pVVar4;
  VkDevice pVVar5;
  Handle<(vk::HandleType)9> *pHVar6;
  TextureFormat *this_00;
  Move<vk::Handle<(vk::HandleType)13>_> local_168;
  RefData<vk::Handle<(vk::HandleType)13>_> local_148;
  Move<vk::Handle<(vk::HandleType)9>_> local_128;
  RefData<vk::Handle<(vk::HandleType)9>_> local_108;
  deUint64 local_e8;
  deUint64 local_e0;
  Move<vk::Handle<(vk::HandleType)13>_> local_d8;
  RefData<vk::Handle<(vk::HandleType)13>_> local_b8;
  Move<vk::Handle<(vk::HandleType)9>_> local_98;
  RefData<vk::Handle<(vk::HandleType)9>_> local_78;
  VkImageLayout local_54;
  DefaultDeleter<vk::Allocation> local_4e;
  DefaultDeleter<vk::Allocation> local_4d;
  VkImageLayout layout;
  Allocator *local_40;
  Allocator *allocator_local;
  VkQueue queue_local;
  VkDevice pVStack_28;
  deUint32 queueFamilyIndex_local;
  VkDevice device_local;
  DeviceInterface *vki_local;
  ImageInstanceImages *this_local;
  
  this->m_viewType = viewType;
  this->m_baseMipLevel = baseMipLevel;
  this->m_baseArraySlice = baseArraySlice;
  this_00 = &this->m_imageFormat;
  local_40 = allocator;
  allocator_local = (Allocator *)queue;
  queue_local._4_4_ = queueFamilyIndex;
  pVStack_28 = device;
  device_local = (VkDevice)vki;
  vki_local = (DeviceInterface *)this;
  tcu::TextureFormat::TextureFormat(this_00,RGBA,UNORM_INT8);
  tcu::TextureLevelPyramid::TextureLevelPyramid(&this->m_sourceImageA,this_00,2);
  tcu::TextureLevelPyramid::TextureLevelPyramid(&this->m_sourceImageB,this_00,2);
  de::DefaultDeleter<vk::Allocation>::DefaultDeleter(&local_4d);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_imageMemoryA,0);
  de::DefaultDeleter<vk::Allocation>::DefaultDeleter(&local_4e);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_imageMemoryB,0);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_imageA);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_imageB);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_imageViewA);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_imageViewB);
  local_54 = getImageLayoutForDescriptorType(descriptorType);
  populateSourceImage(this,&this->m_sourceImageA,true);
  createImage(&local_98,(DeviceInterface *)device_local,pVStack_28,local_40,descriptorType,viewType,
              &this->m_sourceImageA,&this->m_imageMemoryA);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_78,(Move *)&local_98);
  data.deleter.m_deviceIface._0_4_ = (int)local_78.deleter.m_deviceIface;
  data.object.m_internal = local_78.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_78.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_78.deleter.m_device;
  data.deleter.m_allocator = local_78.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_imageA,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_98);
  pVVar5 = device_local;
  pVVar4 = pVStack_28;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_e0 = pHVar6->m_internal;
  createImageView(&local_d8,(DeviceInterface *)pVVar5,pVVar4,viewType,&this->m_sourceImageA,
                  (VkImage)local_e0,this->m_baseMipLevel,this->m_baseArraySlice);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b8,(Move *)&local_d8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_b8.deleter.m_deviceIface;
  data_00.object.m_internal = local_b8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_b8.deleter.m_device;
  data_00.deleter.m_allocator = local_b8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_imageViewA,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_d8);
  pVVar5 = device_local;
  pVVar4 = pVStack_28;
  dVar3 = queue_local._4_4_;
  pAVar2 = allocator_local;
  pAVar1 = local_40;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                     (&(this->m_imageA).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  local_e8 = pHVar6->m_internal;
  uploadImage(this,(DeviceInterface *)pVVar5,pVVar4,dVar3,(VkQueue)pAVar2,pAVar1,(VkImage)local_e8,
              local_54,&this->m_sourceImageA);
  if (numImages == 2) {
    populateSourceImage(this,&this->m_sourceImageB,false);
    createImage(&local_128,(DeviceInterface *)device_local,pVStack_28,local_40,descriptorType,
                viewType,&this->m_sourceImageB,&this->m_imageMemoryB);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_108,(Move *)&local_128);
    data_01.deleter.m_deviceIface._0_4_ = (int)local_108.deleter.m_deviceIface;
    data_01.object.m_internal = local_108.object.m_internal;
    data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_108.deleter.m_deviceIface >> 0x20);
    data_01.deleter.m_device = local_108.deleter.m_device;
    data_01.deleter.m_allocator = local_108.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_imageB,data_01);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_128);
    pVVar5 = device_local;
    pVVar4 = pVStack_28;
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    createImageView(&local_168,(DeviceInterface *)pVVar5,pVVar4,viewType,&this->m_sourceImageB,
                    (VkImage)pHVar6->m_internal,this->m_baseMipLevel,this->m_baseArraySlice);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_148,(Move *)&local_168);
    data_02.deleter.m_deviceIface._0_4_ = (int)local_148.deleter.m_deviceIface;
    data_02.object.m_internal = local_148.object.m_internal;
    data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_148.deleter.m_deviceIface >> 0x20);
    data_02.deleter.m_device = local_148.deleter.m_device;
    data_02.deleter.m_allocator = local_148.deleter.m_allocator;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=(&this->m_imageViewB,data_02);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_168);
    pVVar5 = device_local;
    pVVar4 = pVStack_28;
    dVar3 = queue_local._4_4_;
    pAVar2 = allocator_local;
    pAVar1 = local_40;
    pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                       (&(this->m_imageB).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
    uploadImage(this,(DeviceInterface *)pVVar5,pVVar4,dVar3,(VkQueue)pAVar2,pAVar1,
                (VkImage)pHVar6->m_internal,local_54,&this->m_sourceImageB);
  }
  return;
}

Assistant:

ImageInstanceImages::ImageInstanceImages (const vk::DeviceInterface&	vki,
										  vk::VkDevice					device,
										  deUint32						queueFamilyIndex,
										  vk::VkQueue					queue,
										  vk::Allocator&				allocator,
										  vk::VkDescriptorType			descriptorType,
										  vk::VkImageViewType			viewType,
										  int							numImages,
										  deUint32						baseMipLevel,
										  deUint32						baseArraySlice)
	: m_viewType		(viewType)
	, m_baseMipLevel	(baseMipLevel)
	, m_baseArraySlice	(baseArraySlice)
	, m_imageFormat		(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8)
	, m_sourceImageA	(m_imageFormat, NUM_MIP_LEVELS)
	, m_sourceImageB	(m_imageFormat, NUM_MIP_LEVELS)
	, m_imageMemoryA	(DE_NULL)
	, m_imageMemoryB	(DE_NULL)
	, m_imageA			(vk::Move<vk::VkImage>())
	, m_imageB			(vk::Move<vk::VkImage>())
	, m_imageViewA		(vk::Move<vk::VkImageView>())
	, m_imageViewB		(vk::Move<vk::VkImageView>())
{
	const vk::VkImageLayout	layout	= getImageLayoutForDescriptorType(descriptorType);

	DE_ASSERT(numImages == 1 || numImages == 2);

	populateSourceImage(&m_sourceImageA, true);
	m_imageA = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageA, &m_imageMemoryA);
	m_imageViewA = createImageView(vki, device, viewType, m_sourceImageA, *m_imageA, m_baseMipLevel, m_baseArraySlice);
	uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageA, layout, m_sourceImageA);

	if (numImages == 2)
	{
		populateSourceImage(&m_sourceImageB, false);
		m_imageB = createImage(vki, device, allocator, descriptorType, viewType, m_sourceImageB, &m_imageMemoryB);
		m_imageViewB = createImageView(vki, device, viewType, m_sourceImageB, *m_imageB, m_baseMipLevel, m_baseArraySlice);
		uploadImage(vki, device, queueFamilyIndex, queue, allocator, *m_imageB, layout, m_sourceImageB);
	}
}